

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gabby.cc
# Opt level: O0

int __thiscall GB::Disassemble(GB *this,u16 addr,char *buffer,size_t size)

{
  u8 *puVar1;
  uchar *puVar2;
  uint local_b4;
  char local_80 [4];
  u8 local_7c;
  byte local_7b;
  byte local_7a;
  byte local_79;
  char bank [3];
  u8 byte2;
  u8 byte1;
  u8 byte;
  u8 num_bytes;
  u8 opcode;
  char *mnemonic;
  char bytes [2] [3];
  char temp [64];
  size_t size_local;
  char *buffer_local;
  u16 addr_local;
  GB *this_local;
  
  mnemonic._4_2_ = 0x20;
  mnemonic._0_4_ = 0x20002020;
  _bank = "*INVALID*";
  local_79 = Read(this,addr);
  local_7a = "\x01\x03\x01\x01\x01\x01\x02\x01\x03\x01\x01\x01\x01\x01\x02\x01\x01\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x02\x03\x01\x01\x01\x01\x02\x01\x02\x01\x01\x01\x01\x01\x02\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x01\x03\x03\x03\x01\x02\x01\x01\x01\x03\x02\x03\x03\x02\x01\x01\x01\x03"
             [local_79];
  switch(local_7a) {
  case 0:
    break;
  case 1:
    _bank = s_opcode_mnemonic[local_79];
    break;
  case 2:
    local_7b = Read(this,addr + 1);
    sprint_hex((char *)&mnemonic,local_7b);
    if (local_79 == 0xcb) {
      _bank = s_cb_opcode_mnemonic[local_7b];
    }
    else {
      snprintf(bytes[0],0x40,s_opcode_mnemonic[local_79],(ulong)local_7b);
      _bank = bytes[0];
    }
    break;
  case 3:
    local_7c = Read(this,addr + 1);
    local_80[3] = Read(this,addr + 2);
    sprint_hex((char *)&mnemonic,local_7c);
    sprint_hex((char *)((long)&mnemonic + 3),local_80[3]);
    snprintf(bytes[0],0x40,s_opcode_mnemonic[local_79],(ulong)CONCAT11(local_80[3],local_7c));
    _bank = bytes[0];
    break;
  default:
    __assert_fail("!\"invalid opcode byte length.\\n\"",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/binji[P]gabby/src/gabby.cc"
                  ,0x837,"int GB::Disassemble(u16, char *, size_t)");
  }
  local_80[0] = '?';
  local_80[1] = '?';
  local_80[2] = 0;
  if ((uint)((int)(uint)addr >> 0xc) < 4) {
    puVar1 = (this->s).rom0p;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->rom);
    sprint_hex(local_80,(u8)((long)puVar1 - (long)puVar2 >> 0xe));
  }
  else if ((uint)((int)(uint)addr >> 0xc) < 8) {
    puVar1 = (this->s).rom1p;
    puVar2 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::data(&this->rom);
    sprint_hex(local_80,(u8)((long)puVar1 - (long)puVar2 >> 0xe));
  }
  snprintf(buffer,size,"[%s]%#06x: %02x %s %s  %-15s",local_80,(ulong)addr,(ulong)local_79,&mnemonic
           ,(long)&mnemonic + 3,_bank);
  if (local_7a == 0) {
    local_b4 = 1;
  }
  else {
    local_b4 = (uint)local_7a;
  }
  return local_b4;
}

Assistant:

int GB::Disassemble(u16 addr, char* buffer, size_t size) {
  char temp[64];
  char bytes[][3] = {"  ", "  "};
  const char* mnemonic = "*INVALID*";

  u8 opcode = Read(addr);
  u8 num_bytes = s_opcode_bytes[opcode];
  switch (num_bytes) {
    case 0: break;
    case 1: mnemonic = s_opcode_mnemonic[opcode]; break;
    case 2: {
      u8 byte = Read(addr + 1);
      sprint_hex(bytes[0], byte);
      if (opcode == 0xcb) {
        mnemonic = s_cb_opcode_mnemonic[byte];
      } else {
        snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode], byte);
        mnemonic = temp;
      }
      break;
    }
    case 3: {
      u8 byte1 = Read(addr + 1);
      u8 byte2 = Read(addr + 2);
      sprint_hex(bytes[0], byte1);
      sprint_hex(bytes[1], byte2);
      snprintf(temp, sizeof(temp), s_opcode_mnemonic[opcode],
               (byte2 << 8) | byte1);
      mnemonic = temp;
      break;
    }
    default: assert(!"invalid opcode byte length.\n"); break;
  }

  char bank[3] = "??";
  if ((addr >> 12) < 4) {
    sprint_hex(bank, (s.rom0p - rom.data()) >> 14);
  } else if ((addr >> 12) < 8) {
    sprint_hex(bank, (s.rom1p - rom.data()) >> 14);
  }

  snprintf(buffer, size, "[%s]%#06x: %02x %s %s  %-15s", bank, addr, opcode,
           bytes[0], bytes[1], mnemonic);
  return num_bytes ? num_bytes : 1;
}